

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit.c
# Opt level: O3

ch_dataptr ch_emit_commit_scope(ch_emit *emit)

{
  ch_emit_scope *pcVar1;
  uint8_t *data_start;
  ch_dataptr cVar2;
  
  pcVar1 = emit->emit_scope;
  data_start = (pcVar1->bytecode).start;
  cVar2 = ch_emit_write(&emit->function_bytecode,data_start,
                        (long)(pcVar1->bytecode).current - (long)data_start);
  free((pcVar1->bytecode).start);
  (pcVar1->bytecode).start = (uint8_t *)0x0;
  (pcVar1->bytecode).current = (uint8_t *)0x0;
  (pcVar1->bytecode).size = 0;
  emit->emit_scope = emit->emit_scope->parent;
  return cVar2;
}

Assistant:

ch_dataptr ch_emit_commit_scope(ch_emit *emit) {
  // TODO check if function_ptr exceeds UINT32_MAX (of ch_dataptr)
  // TODO check if emit_scope is not NULL

  ch_blob *bytecode = &emit->emit_scope->bytecode;
  ch_dataptr function_ptr = ch_emit_write(
      &emit->function_bytecode, bytecode->start, CH_BLOB_CONTENT_SIZE(bytecode));

  free_blob(bytecode);
  emit->emit_scope = emit->emit_scope->parent;

  return function_ptr;
}